

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array2d_kernel.h
# Opt level: O0

void __thiscall
dlib::array2d<dlib::text_grid::data_type,_dlib::memory_manager_stateless_kernel_1<char>_>::clear
          (array2d<dlib::text_grid::data_type,_dlib::memory_manager_stateless_kernel_1<char>_> *this
          )

{
  long in_RDI;
  data_type *in_stack_00000008;
  
  if (*(long *)(in_RDI + 8) != 0) {
    memory_manager_stateless_kernel_1<dlib::text_grid::data_type>::deallocate_array
              ((memory_manager_stateless_kernel_1<dlib::text_grid::data_type> *)this,
               in_stack_00000008);
    *(undefined8 *)(in_RDI + 0x10) = 0;
    *(undefined8 *)(in_RDI + 0x18) = 0;
    *(undefined8 *)(in_RDI + 8) = 0;
    *(undefined1 *)(in_RDI + 0x38) = 1;
    *(undefined8 *)(in_RDI + 0x28) = 0;
    *(undefined8 *)(in_RDI + 0x30) = 0;
  }
  return;
}

Assistant:

void clear (
        )
        {
            if (data != 0)
            {
                pool.deallocate_array(data);
                nc_ = 0;
                nr_ = 0;
                data = 0;
                at_start_ = true;
                cur = 0;
                last = 0;
            }
        }